

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

void __thiscall
QInputDialogPrivate::currentRowChanged
          (QInputDialogPrivate *this,QModelIndex *newIndex,QModelIndex *param_3)

{
  QAbstractItemModel *pQVar1;
  undefined8 in_RDX;
  QComboBox *in_RSI;
  QInputDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QVariant *this_00;
  undefined1 enable;
  StandardButton which;
  QVariant local_28;
  long local_8;
  
  which = (StandardButton)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QComboBox::model(in_RSI);
  this_00 = &local_28;
  (**(code **)(*(long *)pQVar1 + 0x90))(this_00,pQVar1,in_RSI,0);
  ::QVariant::toString();
  textChanged(in_RDI,(QString *)this_00);
  QString::~QString((QString *)0x79b358);
  ::QVariant::~QVariant(this_00);
  enable = (undefined1)((ulong)this_00 >> 0x38);
  QDialogButtonBox::button((QDialogButtonBox *)in_RSI,which);
  QWidget::setEnabled((QWidget *)in_RDI,(bool)enable);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::currentRowChanged(const QModelIndex &newIndex,
                                            const QModelIndex & /* oldIndex */)
{
    textChanged(comboBox->model()->data(newIndex).toString());
    buttonBox->button(QDialogButtonBox::Ok)->setEnabled(true);
}